

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::data_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::data_entry,_std::allocator<setup::data_entry>_> *result,enum_type entry_type
          )

{
  pointer pdVar1;
  _Base_bitset<1UL> _Var2;
  long lVar3;
  bool bVar4;
  data_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_b8;
  data_entry local_b0;
  
  pdVar1 = (result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>)._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_b8._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  _Var2._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_b8,entry_type);
  if ((_Base_bitset<1UL>)_Var2._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      local_b0.options._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
      data_entry::load(&local_b0,is,this);
    }
  }
  else {
    std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::resize(result,count);
    lVar3 = 0;
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      data_entry::load((data_entry *)
                       ((long)&(((result->
                                 super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->chunk).first_slice +
                       lVar3),is,this);
      lVar3 = lVar3 + 0x88;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}